

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

module_ * __thiscall
pybind11::module_::def<char_const*(*)(int),pybind11::arg,char[58]>
          (module_ *this,char *name_,_func_char_ptr_int **f,arg *extra,char (*extra_1) [58])

{
  _func_char_ptr_int *f_00;
  cpp_function func;
  handle local_60;
  handle local_58;
  object local_50;
  handle local_48;
  name local_40;
  sibling local_38;
  
  f_00 = *f;
  local_48.m_ptr = (this->super_object).super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.value = name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38.value.m_ptr = (handle)(handle)local_60.m_ptr;
  cpp_function::
  cpp_function<char_const*,int,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[58]>
            ((cpp_function *)&local_58,f_00,&local_40,(scope *)&local_48,&local_38,extra,extra_1);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  add_object(this,name_,local_58,true);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }